

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

int run_test_fs_event_stop_in_cb(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  char path [24];
  uv_timer_t timer;
  uv_fs_event_t fs;
  
  eval_a._0_1_ = 'f';
  eval_a._1_1_ = 's';
  eval_a._2_1_ = '_';
  eval_a._3_1_ = 'e';
  eval_a._4_1_ = 'v';
  eval_a._5_1_ = 'e';
  eval_a._6_1_ = 'n';
  eval_a._7_1_ = 't';
  builtin_strncpy(path,"_stop_in_cb.txt",0x10);
  remove((char *)&eval_a);
  create_file((char *)&eval_a);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_event_init(puVar2,(uv_fs_event_t *)&timer.start_id);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x4c6,"uv_fs_event_init(uv_default_loop(), &fs)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_fs_event_start((uv_fs_event_t *)&timer.start_id,fs_event_cb_stop,(char *)&eval_a,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x4c7,"uv_fs_event_start(&fs, fs_event_cb_stop, path, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  path._16_8_ = &eval_a;
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)(path + 0x10));
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x4cb,"uv_timer_init(uv_default_loop(), &timer)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_start((uv_timer_t *)(path + 0x10),timer_cb_touch,100,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x4cc,"uv_timer_start(&timer, timer_cb_touch, 100, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)fs_event_cb_stop_calls != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x4ce,"fs_event_cb_stop_calls","==","0",(long)fs_event_cb_stop_calls,"==",0);
    abort();
  }
  if ((long)timer_cb_touch_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x4cf,"timer_cb_touch_called","==","0",(long)timer_cb_touch_called,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x4d1,"uv_run(uv_default_loop(), UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)fs_event_cb_stop_calls != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x4d3,"1","==","fs_event_cb_stop_calls",1,"==",(long)fs_event_cb_stop_calls);
    abort();
  }
  if ((long)timer_cb_touch_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x4d4,"1","==","timer_cb_touch_called",1,"==",(long)timer_cb_touch_called);
    abort();
  }
  uv_close((uv_handle_t *)&timer.start_id,(uv_close_cb)0x0);
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x4d7,"uv_run(uv_default_loop(), UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)fs_event_cb_stop_calls != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x4d8,"1","==","fs_event_cb_stop_calls",1,"==",(long)fs_event_cb_stop_calls);
    abort();
  }
  remove((char *)&eval_a);
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
            ,0x4dc,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(fs_event_stop_in_cb) {
  uv_fs_event_t fs;
  uv_timer_t timer;
  char path[] = "fs_event_stop_in_cb.txt";

#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  remove(path);
  create_file(path);

  ASSERT_OK(uv_fs_event_init(uv_default_loop(), &fs));
  ASSERT_OK(uv_fs_event_start(&fs, fs_event_cb_stop, path, 0));

  /* Note: timer_cb_touch() closes the handle. */
  timer.data = path;
  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_cb_touch, 100, 0));

  ASSERT_OK(fs_event_cb_stop_calls);
  ASSERT_OK(timer_cb_touch_called);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, fs_event_cb_stop_calls);
  ASSERT_EQ(1, timer_cb_touch_called);

  uv_close((uv_handle_t*) &fs, NULL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(1, fs_event_cb_stop_calls);

  remove(path);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}